

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O2

void skiwi::compile_cinput_parameters(cinput_data *cinput,environment_map *env,asmcode *code)

{
  int iVar1;
  pointer ppVar2;
  bool bVar3;
  long lVar4;
  string *psVar5;
  operand *poVar6;
  operand *poVar7;
  operand local_100 [4];
  uint64_t header;
  int local_e4;
  ulong local_e0;
  uint local_d4;
  long local_d0;
  asmcode *local_c8;
  cinput_data *local_c0;
  environment_map *local_b8;
  environment_entry e;
  string name;
  string local_70;
  string local_50;
  
  lVar4 = 0;
  local_e0 = 1;
  local_d0 = 0;
  local_d4 = 0;
  local_e4 = 0;
  local_c8 = code;
  local_c0 = cinput;
  local_b8 = env;
  while( true ) {
    poVar6 = local_100 + 2;
    ppVar2 = (cinput->parameters).
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((int)(((long)(cinput->parameters).
                     super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_skiwi::cinput_data::cinput_type>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2) / 0x28) <= local_d0)
    break;
    iVar1 = *(int *)((long)&ppVar2->second + lVar4);
    psVar5 = (string *)((long)&(ppVar2->first)._M_dataplus + lVar4);
    if (iVar1 == 0) {
      std::__cxx11::string::string((string *)&name,psVar5);
      bVar3 = environment<skiwi::environment_entry>::find
                        ((local_b8->
                         super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,&e,&name);
      if (!bVar3 || e.st != st_global) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_70,"",(allocator<char> *)&header);
        throw_error(invalid_c_input_syntax,&local_70);
        std::__cxx11::string::~string((string *)&local_70);
      }
      header = 0x100000000000001;
      local_100[1] = 0x40;
      local_100[2] = 0x18;
      local_100[0] = RBP;
      poVar7 = local_100 + 1;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
                (code,poVar7,poVar6,local_100);
      local_100[1] = 0x49;
      local_100[2] = 0x18;
      local_100[0] = NUMBER;
      local_100[3] = 5;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                (code,poVar7,poVar6,local_100,(int *)(local_100 + 3));
      local_100[1] = 0x40;
      local_100[2] = 9;
      local_100[0] = NUMBER;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
                (code,poVar7,poVar6,local_100,&header);
      local_100[1] = 0x40;
      local_100[2] = 0x20;
      local_100[0] = RAX;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
                (code,poVar7,poVar6,local_100);
      poVar6 = local_100 + 3;
      if (local_d4 < 8) {
        poVar7 = local_100 + 2;
        switch(local_d4) {
        case 0:
          local_100[1] = 0x41;
          local_100[2] = 0x20;
          local_100[0] = DH;
          local_100[3] = 0x43;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,local_100 + 1,poVar7,(int *)local_100,poVar6);
          break;
        case 1:
          local_100[1] = 0x41;
          local_100[2] = 0x20;
          local_100[0] = DH;
          local_100[3] = 0x44;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,local_100 + 1,poVar7,(int *)local_100,poVar6);
          break;
        case 2:
          local_100[1] = 0x41;
          local_100[2] = 0x20;
          local_100[0] = DH;
          local_100[3] = 0x45;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,local_100 + 1,poVar7,(int *)local_100,poVar6);
          break;
        case 3:
          local_100[1] = 0x41;
          local_100[2] = 0x20;
          local_100[0] = DH;
          local_100[3] = 0x46;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,local_100 + 1,poVar7,(int *)local_100,poVar6);
          break;
        case 4:
          local_100[1] = 0x41;
          local_100[2] = 0x20;
          local_100[0] = DH;
          local_100[3] = 0x47;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,local_100 + 1,poVar7,(int *)local_100,poVar6);
          break;
        case 5:
          local_100[1] = 0x41;
          local_100[2] = 0x20;
          local_100[0] = DH;
          local_100[3] = 0x48;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,local_100 + 1,poVar7,(int *)local_100,poVar6);
          break;
        case 6:
          local_100[1] = 0x41;
          local_100[2] = 0x20;
          local_100[0] = DH;
          local_100[3] = 0x49;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,local_100 + 1,poVar7,(int *)local_100,poVar6);
          break;
        case 7:
          local_100[1] = 0x41;
          local_100[2] = 0x20;
          local_100[0] = DH;
          local_100[3] = 0x4a;
          assembler::asmcode::
          add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                    (code,local_100 + 1,poVar7,(int *)local_100,poVar6);
        }
      }
      else {
        local_100[1] = 0x40;
        local_100[2] = 9;
        local_100[0] = MEM_RSP;
        local_100[3] = (int)local_e0 * 8;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,local_100 + 1,local_100 + 2,local_100,(int *)poVar6);
        local_100[1] = 0x40;
        local_100[2] = 0x20;
        local_100[0] = DH;
        local_100[3] = 9;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,int,assembler::asmcode::operand>
                  (code,local_100 + 1,local_100 + 2,(int *)local_100,poVar6);
        local_e0 = (ulong)((int)local_e0 + 1);
        code = local_c8;
      }
      poVar7 = local_100 + 2;
      local_100[1] = 0;
      local_100[2] = 0x10;
      local_100[0] = NUMBER;
      poVar6 = local_100 + 1;
      local_100[3] = local_100[2];
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                (code,poVar6,poVar7,local_100,(int *)(local_100 + 3));
      local_100[1] = 0x40;
      local_100[2] = 9;
      local_100[0] = MEM_R10;
      local_100[3] = 0xa8;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                (code,poVar6,poVar7,local_100,(int *)(local_100 + 3));
      local_100[1] = 0x40;
      local_100[2] = 0x19;
      local_100[0] = R15;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                (code,poVar6,poVar7,&e.pos,local_100);
      local_d4 = local_d4 + 1;
      std::__cxx11::string::~string((string *)&name);
      cinput = local_c0;
      code = local_c8;
    }
    else if (iVar1 == 1) {
      std::__cxx11::string::string((string *)&name,psVar5);
      bVar3 = environment<skiwi::environment_entry>::find
                        ((local_b8->
                         super___shared_ptr<skiwi::environment<skiwi::environment_entry>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr,&e,&name);
      if (!bVar3 || e.st != st_global) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_50,"",(allocator<char> *)&header);
        throw_error(invalid_c_input_syntax,&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      header = CONCAT44(header._4_4_,0x40);
      local_100[1] = 9;
      local_100[2] = 0x23;
      local_100[0] = 0xa8;
      poVar7 = local_100 + 1;
      assembler::asmcode::
      add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                (code,(operation *)&header,poVar7,poVar6,(int *)local_100);
      switch(local_e4) {
      case 0:
        header = CONCAT44(header._4_4_,0x55);
        local_100[1] = 0xd;
        local_100[2] = 0x39;
        local_100[0] = AL;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,(operation *)&header,poVar7,poVar6,(int *)local_100);
        header = CONCAT44(header._4_4_,0x40);
        local_100[1] = 0x19;
        local_100[2] = 0xd;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,(operation *)&header,poVar7,&e.pos,poVar6);
        break;
      case 1:
        header = CONCAT44(header._4_4_,0x55);
        local_100[1] = 0xc;
        local_100[2] = 0x39;
        local_100[0] = AL;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,(operation *)&header,poVar7,poVar6,(int *)local_100);
        header = CONCAT44(header._4_4_,0x40);
        local_100[1] = 0x19;
        local_100[2] = 0xc;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,(operation *)&header,poVar7,&e.pos,poVar6);
        break;
      case 2:
        header = CONCAT44(header._4_4_,0x55);
        local_100[1] = 0xb;
        local_100[2] = 0x39;
        local_100[0] = AL;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,(operation *)&header,poVar7,poVar6,(int *)local_100);
        header = CONCAT44(header._4_4_,0x40);
        local_100[1] = 0x19;
        local_100[2] = 0xb;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,(operation *)&header,poVar7,&e.pos,poVar6);
        break;
      case 3:
        header = CONCAT44(header._4_4_,0x55);
        local_100[1] = 0x11;
        local_100[2] = 0x39;
        local_100[0] = AL;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,(operation *)&header,poVar7,poVar6,(int *)local_100);
        header = CONCAT44(header._4_4_,0x40);
        local_100[1] = 0x19;
        local_100[2] = 0x11;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,(operation *)&header,poVar7,&e.pos,poVar6);
        break;
      case 4:
        header = CONCAT44(header._4_4_,0x55);
        local_100[1] = 0x12;
        local_100[2] = 0x39;
        local_100[0] = AL;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,(operation *)&header,poVar7,poVar6,(int *)local_100);
        header = CONCAT44(header._4_4_,0x40);
        local_100[1] = 0x19;
        local_100[2] = 0x12;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,(operation *)&header,poVar7,&e.pos,poVar6);
        break;
      default:
        header = CONCAT44(header._4_4_,0x40);
        local_100[1] = 0xb;
        local_100[2] = 0x1f;
        local_100[0] = (int)local_e0 * 8;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,(operation *)&header,poVar7,poVar6,(int *)local_100);
        header = CONCAT44(header._4_4_,0x55);
        local_100[1] = 0xb;
        local_100[2] = 0x39;
        local_100[0] = AL;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
                  (code,(operation *)&header,poVar7,poVar6,(int *)local_100);
        header = CONCAT44(header._4_4_,0x40);
        local_100[1] = 0x19;
        local_100[2] = 0xb;
        assembler::asmcode::
        add<assembler::asmcode::operation,assembler::asmcode::operand,unsigned_long&,assembler::asmcode::operand>
                  (code,(operation *)&header,poVar7,&e.pos,poVar6);
        local_e0 = (ulong)((int)local_e0 + 1);
        cinput = local_c0;
      }
      local_e4 = local_e4 + 1;
      std::__cxx11::string::~string((string *)&name);
    }
    local_d0 = local_d0 + 1;
    lVar4 = lVar4 + 0x28;
  }
  return;
}

Assistant:

void compile_cinput_parameters(cinput_data& cinput, environment_map& env, asmcode& code)
  {
#ifdef _WIN32
  for (int j = 0; j < (int)cinput.parameters.size(); ++j)
    {
    if (cinput.parameters[j].second == cinput_data::cin_int)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      if (j == 0)
        {
        code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RDX);
        }
      else if (j == 1)
        {
        code.add(asmcode::SHL, asmcode::R8, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R8);
        }
      else if (j == 2)
        {
        code.add(asmcode::SHL, asmcode::R9, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R9);
        }
      else
        {
        int addr = j - 3;
        code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RSP, (40 + addr * 8));
        code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RCX);
        }
      }
    else if (cinput.parameters[j].second == cinput_data::cin_double)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);

      uint64_t header = make_block_header(1, T_FLONUM);
      code.add(asmcode::MOV, asmcode::R15, ALLOC);
      code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
      code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
      code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);

      if (j == 0)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM1);
      else if (j == 1)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM2);
      else if (j == 2)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM3);
      else
        {
        int addr = j - 3;
        code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RSP, (40 + addr * 8));
        code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RAX);
        }

      code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R15);
      }
    }
#else
  int int_index = 0;
  int double_index = 0;
  int rsp_index = 1;
  for (int j = 0; j < (int)cinput.parameters.size(); ++j)
    {
    if (cinput.parameters[j].second == cinput_data::cin_int)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      if (int_index == 0)
        {
        code.add(asmcode::SHL, asmcode::RSI, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RSI);
        }
      else if (int_index == 1)
        {
        code.add(asmcode::SHL, asmcode::RDX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RDX);
        }
      else if (int_index == 2)
        {
        code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RCX);
        }
      else if (int_index == 3)
        {
        code.add(asmcode::SHL, asmcode::R8, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R8);
        }
      else if (int_index == 4)
        {
        code.add(asmcode::SHL, asmcode::R9, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R9);
        }
      else
        {
        int addr = rsp_index;
        code.add(asmcode::MOV, asmcode::RCX, asmcode::MEM_RSP, 8 * addr);
        code.add(asmcode::SHL, asmcode::RCX, asmcode::NUMBER, 1);
        code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::RCX);
        ++rsp_index;
        }
      ++int_index;
      }
    else if (cinput.parameters[j].second == cinput_data::cin_double)
      {
      std::string name = cinput.parameters[j].first;

      environment_entry e;
      if (!env->find(e, name) || e.st != environment_entry::st_global)
        throw_error(invalid_c_input_syntax);

      uint64_t header = make_block_header(1, T_FLONUM);
      code.add(asmcode::MOV, asmcode::R15, ALLOC);
      code.add(asmcode::OR, asmcode::R15, asmcode::NUMBER, block_tag);
      code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
      code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);

      if (double_index == 0)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM0);
      else if (double_index == 1)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM1);
      else if (double_index == 2)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM2);
      else if (double_index == 3)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM3);
      else if (double_index == 4)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM4);
      else if (double_index == 5)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM5);
      else if (double_index == 6)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM6);
      else if (double_index == 7)
        code.add(asmcode::MOVQ, MEM_ALLOC, CELLS(1), asmcode::XMM7);
      else
        {
        int addr = rsp_index;
        code.add(asmcode::MOV, asmcode::RAX, asmcode::MEM_RSP, 8 * addr);
        code.add(asmcode::MOV, MEM_ALLOC, CELLS(1), asmcode::RAX);
        ++rsp_index;
        }

      code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
      code.add(asmcode::MOV, asmcode::RAX, GLOBALS);
      code.add(asmcode::MOV, asmcode::MEM_RAX, e.pos, asmcode::R15);
      ++double_index;
      }
    }
#endif
  }